

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O3

double __thiscall
icu_63::double_conversion::StringToDoubleConverter::StringToIeee<unsigned_short_const*>
          (StringToDoubleConverter *this,unsigned_short *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  unsigned_short *end;
  ushort uVar1;
  unsigned_short uVar2;
  uint uVar3;
  double dVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  short sVar8;
  unsigned_short uVar9;
  uint uVar10;
  undefined7 in_register_00000009;
  char *pcVar11;
  unsigned_short *puVar12;
  unsigned_short *puVar13;
  byte bVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  bool sign;
  float fVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  bool result_is_junk_1;
  char *start;
  char buffer [782];
  char local_38c;
  unsigned_short *local_388;
  int local_37c;
  uint local_378;
  undefined4 local_374;
  bool local_36d;
  int local_36c;
  undefined1 local_368 [16];
  double_conversion *local_350;
  double_conversion local_348 [792];
  
  *processed_characters_count = 0;
  if (length == 0) {
LAB_002dc02c:
    return this->empty_string_value_;
  }
  end = input + length;
  uVar3 = this->flags_;
  bVar14 = (byte)uVar3;
  local_388 = input;
  if ((uVar3 & 0x18) != 0) {
    do {
      uVar1 = *local_388;
      lVar16 = 0;
      if (uVar1 < 0x80) {
        while ((int)(char)(&kWhitespaceTable7)[lVar16] != (uint)uVar1) {
          lVar16 = lVar16 + 1;
          if (lVar16 == 6) goto LAB_002dc037;
        }
      }
      else {
        while (*(ushort *)((long)&kWhitespaceTable16 + lVar16) != uVar1) {
          lVar16 = lVar16 + 2;
          if (lVar16 == 0x28) goto LAB_002dc037;
        }
      }
      local_388 = local_388 + 1;
    } while (local_388 != end);
    *processed_characters_count = length;
    goto LAB_002dc02c;
  }
  uVar1 = *input;
  goto LAB_002dc057;
LAB_002dc0dd:
  if (lVar16 != 2 && (char)((uVar3 & 0x20) >> 5) == '\0') goto LAB_002dc713;
  local_388 = (unsigned_short *)((long)local_388 + lVar16);
  goto LAB_002dc0fe;
  while( true ) {
    local_37c = local_37c + -1;
    puVar13 = puVar12 + 1;
    if (*puVar12 != 0x30) break;
LAB_002dc605:
    puVar12 = puVar13;
    if (puVar12 == end) {
      *processed_characters_count = length;
      goto LAB_002dc356;
    }
  }
LAB_002dc624:
  do {
    uVar1 = *puVar12;
    if (9 < (ushort)(uVar1 - 0x30)) goto LAB_002dc4b8;
    if (iVar15 < 0x304) {
      lVar16 = (long)(int)uVar20;
      uVar20 = uVar20 + 1;
      local_348[lVar16] = SUB21(uVar1,0);
      iVar15 = iVar15 + 1;
      local_37c = local_37c + -1;
    }
    else {
      bVar6 = (bool)(uVar1 != 0x30 | bVar6);
    }
    puVar12 = puVar12 + 1;
    puVar13 = puVar12;
    local_388 = puVar12;
  } while (puVar12 != end);
  goto LAB_002dc211;
LAB_002dc4b8:
  if (((sVar8 != 0x30) && (local_37c == 0)) && (iVar15 == 0)) goto LAB_002dc713;
  local_388 = puVar12;
  if ((uVar1 | 0x20) == 0x65) {
    if (((~(byte)uVar17 | bVar14 >> 2) & 1) == 0) goto LAB_002dc713;
    puVar13 = puVar12;
    if ((uVar17 & 1) != 0) goto LAB_002dc211;
    local_388 = puVar12 + 1;
    if ((local_388 != end) &&
       ((((uVar2 = *local_388, uVar2 != 0x2d && (uVar9 = 0x2b, uVar2 != 0x2b)) ||
         (puVar12 = puVar12 + 2, local_388 = puVar12, uVar9 = uVar2, puVar12 != end)) &&
        (local_388 != end)))) {
      uVar1 = *local_388;
      puVar12 = (unsigned_short *)(ulong)(uVar1 - 0x3a);
      if (0xfff5 < (ushort)(uVar1 - 0x3a)) {
        iVar15 = 0;
        do {
          local_388 = local_388 + 1;
          if ((iVar15 < 0x6666666) || ((iVar5 = 0x3fffffff, iVar15 == 0x6666666 && (uVar1 < 0x34))))
          {
            iVar5 = (uint)uVar1 + iVar15 * 10 + -0x30;
          }
          iVar15 = iVar5;
        } while ((local_388 != end) && (uVar1 = *local_388, (ushort)(uVar1 - 0x30) < 10));
        local_38c = (char)uVar9;
        iVar5 = -iVar15;
        if (local_38c != '-') {
          iVar5 = iVar15;
        }
        local_37c = local_37c + iVar5;
        goto LAB_002dc708;
      }
    }
    puVar13 = puVar12;
    if ((uVar3 & 4) == 0) goto LAB_002dc713;
    goto LAB_002dc211;
  }
LAB_002dc708:
  if ((((uVar3 & 0x14) != 0) || (local_388 == end)) &&
     ((puVar13 = local_388, (uVar3 & 4) != 0 ||
      (local_378 = uVar17, local_36c = iVar19,
      bVar7 = AdvanceToNonspace<unsigned_short_const*>(&local_388,end), iVar19 = local_36c,
      uVar17 = local_378, !bVar7)))) {
    if ((uVar3 & 0x10) != 0) {
      local_378 = uVar17;
      AdvanceToNonspace<unsigned_short_const*>(&local_388,end);
      uVar17 = local_378;
    }
    goto LAB_002dc211;
  }
  goto LAB_002dc713;
LAB_002dc037:
  if (local_388 != input && (char)((uVar3 & 8) >> 3) == '\0') goto LAB_002dc713;
LAB_002dc057:
  uVar10 = (uint)uVar1;
  if ((uVar1 == 0x2d) || (uVar10 == 0x2b)) {
    sign = uVar1 == 0x2d;
    if (local_388 + 1 != end) {
      lVar16 = 2;
      do {
        uVar10 = (uint)*(ushort *)((long)local_388 + lVar16);
        lVar18 = 0;
        if (uVar10 < 0x80) {
          while ((int)(char)(&kWhitespaceTable7)[lVar18] != uVar10) {
            lVar18 = lVar18 + 1;
            if (lVar18 == 6) goto LAB_002dc0dd;
          }
        }
        else {
          while (*(ushort *)((long)&kWhitespaceTable16 + lVar18) !=
                 *(ushort *)((long)local_388 + lVar16)) {
            lVar18 = lVar18 + 2;
            if (lVar18 == 0x28) goto LAB_002dc0dd;
          }
        }
        lVar18 = lVar16 + 2;
        lVar16 = lVar16 + 2;
      } while ((unsigned_short *)((long)local_388 + lVar18) != end);
    }
  }
  else {
    sign = false;
LAB_002dc0fe:
    pcVar11 = this->infinity_symbol_;
    if ((pcVar11 == (char *)0x0) || (uVar10 != (int)*pcVar11)) {
      pcVar11 = this->nan_symbol_;
      if ((pcVar11 == (char *)0x0) || (uVar10 != (int)*pcVar11)) {
        iVar15 = 0;
        sVar8 = (short)uVar10;
        local_374 = (undefined4)CONCAT71(in_register_00000009,read_as_double);
        if (sVar8 != 0x30) {
          uVar10 = 0;
          puVar13 = local_388;
LAB_002dc19b:
          local_368._8_8_ = local_368._0_8_;
          local_368._0_8_ = processed_characters_count;
          iVar19 = 0;
          bVar6 = false;
          uVar20 = 0;
          do {
            uVar1 = *puVar13;
            if (9 < (ushort)(uVar1 - 0x30)) {
              uVar17 = uVar10;
              if (iVar15 == 0) {
                uVar17 = 0;
              }
              if (uVar1 != 0x2e) {
                local_37c = 0;
                puVar12 = puVar13;
                goto LAB_002dc4b8;
              }
              if (((~(byte)uVar17 | bVar14 >> 2) & 1) == 0) goto LAB_002dc713;
              local_37c = 0;
              local_388 = puVar13;
              if ((uVar17 & 1) != 0) goto LAB_002dc211;
              puVar12 = puVar13 + 1;
              if (puVar12 == end) {
                local_388 = puVar12;
                uVar17 = uVar10;
                if (iVar15 != 0) goto LAB_002dc211;
                if (sVar8 == 0x30) goto LAB_002dc41e;
                goto LAB_002dc713;
              }
              local_37c = 0;
              if ((iVar15 != 0) || (*puVar12 != 0x30)) goto LAB_002dc624;
              local_37c = 0;
              puVar13 = puVar13 + 2;
              goto LAB_002dc605;
            }
            if (iVar15 < 0x304) {
              lVar16 = (long)(int)uVar20;
              uVar20 = uVar20 + 1;
              local_348[lVar16] = SUB21(uVar1,0);
              iVar15 = iVar15 + 1;
            }
            else {
              iVar19 = iVar19 + 1;
              bVar6 = (bool)(uVar1 != 0x30 | bVar6);
            }
            if ((uVar10 & 1) == 0) {
              uVar10 = 0;
            }
            else {
              uVar10 = (uint)(*puVar13 < 0x38);
            }
            puVar13 = puVar13 + 1;
          } while (puVar13 != end);
          local_37c = 0;
          local_388 = end;
          uVar17 = uVar10;
LAB_002dc211:
          if ((uVar17 & 1) != 0) {
            local_350 = local_348;
            dVar4 = RadixStringToIeee<3,char*>
                              ((char **)&local_350,(char *)(local_348 + (int)uVar20),sign,
                               SUB41((uVar3 & 4) >> 2,0),this->junk_string_value_,
                               (bool)(char)local_374,&local_36d);
            *(int *)local_368._0_8_ = (int)((ulong)((long)local_388 - (long)input) >> 1);
            return dVar4;
          }
          iVar19 = iVar19 + local_37c;
LAB_002dc41e:
          if (bVar6) {
            lVar16 = (long)(int)uVar20;
            uVar20 = uVar20 + 1;
            local_348[lVar16] = (double_conversion)0x31;
            iVar19 = iVar19 + -1;
          }
          local_348[(int)uVar20] = (double_conversion)0x0;
          if ((char)local_374 == '\0') {
            buffer_01.start_ = (ulong)uVar20;
            buffer_01.length_ = iVar19;
            buffer_01._12_4_ = 0;
            fVar21 = Strtof(local_348,buffer_01,(int)puVar13);
            dVar4 = (double)fVar21;
          }
          else {
            buffer_00.start_ = (ulong)uVar20;
            buffer_00.length_ = iVar19;
            buffer_00._12_4_ = 0;
            dVar4 = Strtod(local_348,buffer_00,(int)puVar13);
          }
          *(int *)local_368._0_8_ = (int)((ulong)((long)local_388 - (long)input) >> 1);
          if (sign == false) {
            return dVar4;
          }
          return -dVar4;
        }
        puVar13 = local_388 + 1;
        if (puVar13 != end) {
          if (((uVar3 & 1) != 0) && ((*puVar13 | 0x20) == 0x78)) {
            local_388 = local_388 + 2;
            if ((local_388 != end) &&
               ((uVar1 = *local_388, uVar1 < 0x40 && uVar1 - 0x30 < 10 ||
                ((uVar10 = uVar1 - 0x41, uVar10 < 0x26 &&
                 ((0x3f0000003fU >> ((ulong)uVar10 & 0x3f) & 1) != 0)))))) {
              local_368._0_8_ =
                   RadixStringToIeee<4,unsigned_short_const*>
                             (&local_388,end,sign,SUB41((uVar3 & 4) >> 2,0),this->junk_string_value_
                              ,read_as_double,(bool *)local_348);
              if (local_348[0] != (double_conversion)0x0) {
                return (double)local_368._0_8_;
              }
              if ((uVar3 & 0x10) != 0) {
                local_368._8_4_ = extraout_XMM0_Dc;
                local_368._12_4_ = extraout_XMM0_Dd;
                AdvanceToNonspace<unsigned_short_const*>(&local_388,end);
              }
              *processed_characters_count = (int)((ulong)((long)local_388 - (long)input) >> 1);
              return (double)local_368._0_8_;
            }
            goto LAB_002dc713;
          }
          do {
            if (*puVar13 != 0x30) {
              uVar10 = (uint)(bVar14 >> 1);
              goto LAB_002dc19b;
            }
            puVar13 = puVar13 + 1;
          } while (puVar13 != end);
        }
        *processed_characters_count = length;
LAB_002dc356:
        if (!sign) {
          return 0.0;
        }
        return -0.0;
      }
      while( true ) {
        local_388 = local_388 + 1;
        pcVar11 = pcVar11 + 1;
        if (*pcVar11 == '\0') break;
        if ((local_388 == end) || ((uint)*local_388 != (int)*pcVar11)) goto LAB_002dc713;
      }
      if ((((uVar3 & 0x14) != 0) || (local_388 == end)) &&
         (((uVar3 & 4) != 0 ||
          (bVar6 = AdvanceToNonspace<unsigned_short_const*>(&local_388,end), !bVar6)))) {
        *processed_characters_count = (int)((ulong)((long)local_388 - (long)input) >> 1);
        if (sign != false) {
          return -NAN;
        }
        return NAN;
      }
    }
    else {
      while( true ) {
        local_388 = local_388 + 1;
        pcVar11 = pcVar11 + 1;
        if (*pcVar11 == '\0') break;
        if ((local_388 == end) || ((uint)*local_388 != (int)*pcVar11)) goto LAB_002dc713;
      }
      if ((((uVar3 & 0x14) != 0) || (local_388 == end)) &&
         (((uVar3 & 4) != 0 ||
          (bVar6 = AdvanceToNonspace<unsigned_short_const*>(&local_388,end), !bVar6)))) {
        *processed_characters_count = (int)((ulong)((long)local_388 - (long)input) >> 1);
        if (sign != false) {
          return -INFINITY;
        }
        return INFINITY;
      }
    }
  }
LAB_002dc713:
  return this->junk_string_value_;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}